

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_4::SwapBuffersTest::executeForConfig
          (SwapBuffersTest *this,EGLDisplay display,EGLConfig config)

{
  glActiveTextureFunc *pp_Var1;
  TestLog *pTVar2;
  SwapBuffersTest *pSVar3;
  bool bVar4;
  deUint32 dVar5;
  EGLint EVar6;
  int iVar7;
  GLuint GVar8;
  GLuint GVar9;
  GLuint GVar10;
  GLenum GVar11;
  Library *egl;
  NativeWindowFactory *pNVar12;
  undefined4 extraout_var;
  EGLSurface surface_00;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  TestError *this_01;
  size_t sVar13;
  void *__buf;
  void *__buf_00;
  allocator<char> local_1cd1;
  deInt32 fragmentCompileStatus;
  deInt32 vertexCompileStatus;
  SwapBuffersTest *local_1cc8;
  deInt32 linkStatus;
  UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> window;
  deInt32 infoLogLength;
  float fStack_1ca4;
  _Alloc_hider _Stack_1ca0;
  ScopedLogSection logSection;
  UniqueSurface surface;
  string fragmentInfoLog;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c18;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  string vertexInfoLog;
  string local_1bb8;
  string programInfoLog;
  char *fragmentShaderSource;
  char *vertexShaderSource;
  string local_1b68;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  UniqueContext context;
  string configIdStr;
  TextureLevel blackFrame;
  TextureLevel whiteFrame;
  TextureLevel frameEnd;
  TextureLevel frameBegin;
  Functions gl;
  
  egl = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gl);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3028);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,"getConfigAttrib(display, config , EGL_CONFIG_ID, &id)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                   ,0x72);
  std::ostream::operator<<(&gl,infoLogLength);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gl);
  pTVar2 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&infoLogLength
                 ,"Config ID ",&configIdStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gl,(char *)_infoLogLength,(allocator<char> *)&whiteFrame);
  std::operator+(&local_1c18,"Config ID ",&configIdStr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b68,local_1c18._M_dataplus._M_p,(allocator<char> *)&blackFrame);
  tcu::ScopedLogSection::ScopedLogSection(&logSection,pTVar2,(string *)&gl,&local_1b68);
  std::__cxx11::string::~string((string *)&local_1b68);
  std::__cxx11::string::~string((string *)&local_1c18);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::string::~string((string *)&infoLogLength);
  pNVar12 = eglu::selectNativeWindowFactory
                      (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                       m_nativeDisplayFactory,
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
  if ((pNVar12->m_capabilities & CAPABILITY_READ_SCREEN_PIXELS) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"eglu::NativeWindow doesn\'t support readScreenPixels()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
               ,0x114);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar2 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  pp_Var1 = &gl.activeTexture;
  local_1cc8 = this;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_RED_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(egl,display,config,0x3024);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_GREEN_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(egl,display,config,0x3023);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_BLUE_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(egl,display,config,0x3022);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_ALPHA_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(egl,display,config,0x3021);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_DEPTH_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(egl,display,config,0x3025);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_STENCIL_SIZE: ");
  EVar6 = eglu::getConfigAttribInt(egl,display,config,0x3026);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"EGL_SAMPLES: ");
  EVar6 = eglu::getConfigAttribInt(egl,display,config,0x3031);
  std::ostream::operator<<(pp_Var1,EVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"Waiting ");
  pSVar3 = local_1cc8;
  std::ostream::operator<<(pp_Var1,0x50);
  std::operator<<((ostream *)pp_Var1,
                  "ms after eglSwapBuffers() and glFinish() for frame to become visible");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  gl.activeShaderProgram = (glActiveShaderProgramFunc)0x8000000080;
  gl.activeTexture._0_4_ = 1;
  iVar7 = (*(pNVar12->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar12,(((pSVar3->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                             m_nativeDisplay).
                             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                             .m_data.ptr,display,config);
  window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr =
       (NativeWindow *)CONCAT44(extraout_var,iVar7);
  surface_00 = eglu::createWindowSurface
                         ((((pSVar3->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                          m_nativeDisplay).
                          super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                          .m_data.ptr,
                          window.
                          super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                          .m_data.ptr,display,config,(EGLAttrib *)0x0);
  eglu::UniqueSurface::UniqueSurface(&surface,egl,display,surface_00);
  gl.activeShaderProgram = (glActiveShaderProgramFunc)0x200003098;
  gl.activeTexture._0_4_ = 0x3038;
  (**egl->_vptr_Library)(egl,0x30a0);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                   ,0x4c);
  iVar7 = (*egl->_vptr_Library[6])(egl,display,config,0,&gl);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,"eglCreateContext() failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                   ,0x4f);
  if ((EGLContext)CONCAT44(extraout_var_00,iVar7) == (EGLContext)0x0) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"context",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
               ,0x50);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  eglu::UniqueContext::UniqueContext
            (&context,egl,display,(EGLContext)CONCAT44(extraout_var_00,iVar7));
  glw::Functions::Functions(&gl);
  tcu::TextureLevel::TextureLevel(&whiteFrame);
  tcu::TextureLevel::TextureLevel(&blackFrame);
  tcu::TextureLevel::TextureLevel(&frameBegin);
  tcu::TextureLevel::TextureLevel(&frameEnd);
  EglTestContext::initGLFunctions
            ((pSVar3->super_SimpleConfigCase).super_TestCase.m_eglTestCtx,&gl,(ApiType)0x2);
  (*egl->_vptr_Library[0x27])(egl,display,surface.m_surface);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,"makeCurrent(display, *surface, *surface, *context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                   ,0x131);
  local_1b68._M_dataplus._M_p = (pointer)0x0;
  uStack_1b40 = 0;
  local_1b68._M_string_length = 0x3f400000;
  local_1b68.field_2._M_allocated_capacity._0_4_ = 0x3f400000;
  local_1b68.field_2._M_allocated_capacity._4_4_ = 0x3f400000;
  local_1b68.field_2._8_4_ = 0x3f400000;
  local_1b68.field_2._12_4_ = 0x3f400000;
  local_1b48 = 0x3f40000000000000;
  local_1c18.field_2._M_allocated_capacity = 0;
  local_1c18.field_2._8_8_ = 0;
  local_1c18._M_dataplus._M_p = (pointer)0xbf400000bf400000;
  local_1c18._M_string_length = 0xbf40000000000000;
  local_1bf8 = 0xbf400000;
  uStack_1bf0 = 0xbf400000bf400000;
  pTVar2 = ((pSVar3->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  vertexShaderSource =
       "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
  ;
  vertexInfoLog._M_dataplus._M_p = (pointer)&vertexInfoLog.field_2;
  vertexInfoLog._M_string_length = 0;
  fragmentShaderSource = "void main (void)\n{\n\tgl_FragColor = vec4(0.9, 0.1, 0.4, 1.0);\n}";
  fragmentInfoLog._M_dataplus._M_p = (pointer)&fragmentInfoLog.field_2;
  fragmentInfoLog._M_string_length = 0;
  vertexInfoLog.field_2._M_local_buf[0] = '\0';
  fragmentInfoLog.field_2._M_local_buf[0] = '\0';
  programInfoLog._M_dataplus._M_p = (pointer)&programInfoLog.field_2;
  programInfoLog._M_string_length = 0;
  programInfoLog.field_2._M_local_buf[0] = '\0';
  GVar8 = (*gl.createProgram)();
  GVar9 = (*gl.createShader)(0x8b31);
  GVar10 = (*gl.createShader)(0x8b30);
  GVar11 = (*gl.getError)();
  glu::checkError(GVar11,"Failed to create shaders and program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0x99);
  (*gl.shaderSource)(GVar9,1,&vertexShaderSource,(GLint *)0x0);
  (*gl.compileShader)(GVar9);
  GVar11 = (*gl.getError)();
  glu::checkError(GVar11,"Failed to setup vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0x9d);
  (*gl.shaderSource)(GVar10,1,&fragmentShaderSource,(GLint *)0x0);
  (*gl.compileShader)(GVar10);
  GVar11 = (*gl.getError)();
  glu::checkError(GVar11,"Failed to setup fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xa1);
  infoLogLength = 0;
  (*gl.getShaderiv)(GVar9,0x8b81,&vertexCompileStatus);
  (*gl.getShaderiv)(GVar9,0x8b84,&infoLogLength);
  std::__cxx11::string::resize((ulong)&vertexInfoLog,(char)infoLogLength);
  (*gl.getShaderInfoLog)
            (GVar9,(GLsizei)vertexInfoLog._M_string_length,&infoLogLength,
             vertexInfoLog._M_dataplus._M_p);
  GVar11 = (*gl.getError)();
  glu::checkError(GVar11,"Failed to get vertex shader compile info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xac);
  std::__cxx11::string::resize((ulong)&vertexInfoLog);
  infoLogLength = 0;
  (*gl.getShaderiv)(GVar10,0x8b81,&fragmentCompileStatus);
  (*gl.getShaderiv)(GVar10,0x8b84,&infoLogLength);
  std::__cxx11::string::resize((ulong)&fragmentInfoLog,(char)infoLogLength);
  (*gl.getShaderInfoLog)
            (GVar10,(GLsizei)fragmentInfoLog._M_string_length,&infoLogLength,
             fragmentInfoLog._M_dataplus._M_p);
  GVar11 = (*gl.getError)();
  glu::checkError(GVar11,"Failed to get fragment shader compile info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xba);
  std::__cxx11::string::resize((ulong)&fragmentInfoLog);
  (*gl.attachShader)(GVar8,GVar9);
  (*gl.attachShader)(GVar8,GVar10);
  (*gl.linkProgram)(GVar8);
  GVar11 = (*gl.getError)();
  glu::checkError(GVar11,"Failed to setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xc2);
  _infoLogLength = (TextureFormat)((ulong)(uint)fStack_1ca4 << 0x20);
  (*gl.getProgramiv)(GVar8,0x8b82,&linkStatus);
  (*gl.getProgramiv)(GVar8,0x8b84,&infoLogLength);
  std::__cxx11::string::resize((ulong)&programInfoLog,(char)infoLogLength);
  (*gl.getProgramInfoLog)
            (GVar8,(GLsizei)programInfoLog._M_string_length,&infoLogLength,
             programInfoLog._M_dataplus._M_p);
  GVar11 = (*gl.getError)();
  glu::checkError(GVar11,"Failed to get program link info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xcd);
  std::__cxx11::string::resize((ulong)&programInfoLog);
  if (((linkStatus == 0) || (vertexCompileStatus == 0)) || (fragmentCompileStatus == 0)) {
    tcu::TestLog::startShaderProgram(pTVar2,linkStatus != 0,programInfoLog._M_dataplus._M_p);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1bb8,
               "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
               ,&local_1cd1);
    sVar13 = (size_t)(vertexCompileStatus != 0);
    tcu::LogShader::LogShader
              ((LogShader *)&infoLogLength,QP_SHADER_TYPE_VERTEX,&local_1bb8,
               vertexCompileStatus != 0,&vertexInfoLog);
    tcu::LogShader::write((LogShader *)&infoLogLength,(int)pTVar2,__buf,sVar13);
    tcu::LogShader::~LogShader((LogShader *)&infoLogLength);
    std::__cxx11::string::~string((string *)&local_1bb8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1bb8,
               "void main (void)\n{\n\tgl_FragColor = vec4(0.9, 0.1, 0.4, 1.0);\n}",&local_1cd1);
    sVar13 = (size_t)(fragmentCompileStatus != 0);
    tcu::LogShader::LogShader
              ((LogShader *)&infoLogLength,QP_SHADER_TYPE_FRAGMENT,&local_1bb8,
               fragmentCompileStatus != 0,&fragmentInfoLog);
    tcu::LogShader::write((LogShader *)&infoLogLength,(int)pTVar2,__buf_00,sVar13);
    tcu::LogShader::~LogShader((LogShader *)&infoLogLength);
    std::__cxx11::string::~string((string *)&local_1bb8);
    tcu::TestLog::endShaderProgram(pTVar2);
  }
  (*gl.deleteShader)(GVar9);
  (*gl.deleteShader)(GVar10);
  GVar11 = (*gl.getError)();
  glu::checkError(GVar11,"Failed to delete shaders",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xdf);
  if (((linkStatus == 0) || (vertexCompileStatus == 0)) || (fragmentCompileStatus == 0)) {
    local_1cc8 = (SwapBuffersTest *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              ((TestError *)local_1cc8,(char *)0x0,
               "linkStatus != 0 && vertexCompileStatus != 0 && fragmentCompileStatus != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
               ,0xe1);
    __cxa_throw(local_1cc8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::~string((string *)&programInfoLog);
  std::__cxx11::string::~string((string *)&fragmentInfoLog);
  std::__cxx11::string::~string((string *)&vertexInfoLog);
  (*gl.useProgram)(GVar8);
  pSVar3 = local_1cc8;
  GVar9 = (*gl.getAttribLocation)(GVar8,"a_pos");
  (*gl.enableVertexAttribArray)(GVar9);
  GVar11 = (*gl.getError)();
  glu::checkError(GVar11,"Failed to setup shader program for rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0x150);
  (*gl.clearColor)(1.0,1.0,1.0,1.0);
  (*gl.clear)(0x4000);
  GVar11 = (*gl.getError)();
  glu::checkError(GVar11,"Failed to clear surface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0x155);
  (*egl->_vptr_Library[0x31])(egl,display,surface.m_surface);
  dVar5 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar5,"swapBuffers(display, *surface)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                   ,0x157);
  (*gl.finish)();
  GVar11 = (*gl.getError)();
  glu::checkError(GVar11,"glFinish() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0x159);
  deSleep(0x50);
  (*(window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr
    )->_vptr_NativeWindow[4])();
  (*(window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr
    )->_vptr_NativeWindow[8])
            (window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.
             m_data.ptr,&whiteFrame);
  infoLogLength = 0x3f800000;
  fStack_1ca4 = 1.0;
  _Stack_1ca0._M_p = (pointer)0x3f8000003f800000;
  bVar4 = checkColor(((pSVar3->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log,&whiteFrame,(Vec4 *)&infoLogLength);
  if (bVar4) {
    (*gl.clearColor)(0.0,0.0,0.0,1.0);
    (*gl.clear)(0x4000);
    GVar11 = (*gl.getError)();
    glu::checkError(GVar11,"Failed to clear surface",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                    ,0x167);
    (*egl->_vptr_Library[0x31])(egl,display,surface.m_surface);
    dVar5 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar5,"swapBuffers(display, *surface)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                     ,0x169);
    (*gl.finish)();
    GVar11 = (*gl.getError)();
    glu::checkError(GVar11,"glFinish() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                    ,0x16b);
    deSleep(0x50);
    (*(window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.
      ptr)->_vptr_NativeWindow[4])();
    (*(window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.
      ptr)->_vptr_NativeWindow[8])
              (window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.
               m_data.ptr,&blackFrame);
    infoLogLength = R;
    fStack_1ca4 = 0.0;
    _Stack_1ca0._M_p = (pointer)0x3f80000000000000;
    bVar4 = checkColor(((pSVar3->super_SimpleConfigCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log,&blackFrame,(Vec4 *)&infoLogLength);
    if (bVar4) {
      (*gl.clearColor)(0.7,1.0,0.3,1.0);
      (*gl.clear)(0x4000);
      GVar11 = (*gl.getError)();
      glu::checkError(GVar11,"Failed to clear surface",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x178);
      (*gl.vertexAttribPointer)(GVar9,2,0x1406,'\0',0,&local_1b68);
      (*gl.drawArrays)(4,0,6);
      GVar11 = (*gl.getError)();
      glu::checkError(GVar11,"Failed to render",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x17c);
      (*egl->_vptr_Library[0x31])(egl,display,surface.m_surface);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"swapBuffers(display, *surface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                       ,0x17e);
      (*gl.finish)();
      GVar11 = (*gl.getError)();
      glu::checkError(GVar11,"glFinish() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x180);
      deSleep(0x50);
      (*(window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data
        .ptr)->_vptr_NativeWindow[4])();
      (*(window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data
        .ptr)->_vptr_NativeWindow[8])
                (window.
                 super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.
                 m_data.ptr,&frameBegin);
      (*gl.clearColor)(0.7,0.7,1.0,1.0);
      (*gl.clear)(0x4000);
      GVar11 = (*gl.getError)();
      glu::checkError(GVar11,"Failed to clear surface",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x187);
      (*gl.vertexAttribPointer)(GVar9,2,0x1406,'\0',0,&local_1c18);
      (*gl.drawArrays)(4,0,6);
      GVar11 = (*gl.getError)();
      glu::checkError(GVar11,"Failed to render",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x18b);
      (*gl.finish)();
      GVar11 = (*gl.getError)();
      glu::checkError(GVar11,"glFinish() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x18e);
      deSleep(0x50);
      (*(window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data
        .ptr)->_vptr_NativeWindow[8])
                (window.
                 super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.
                 m_data.ptr,&frameEnd);
      (*egl->_vptr_Library[0x31])(egl,display,surface.m_surface);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"swapBuffers(display, *surface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                       ,0x192);
      (*gl.finish)();
      GVar11 = (*gl.getError)();
      glu::checkError(GVar11,"glFinish() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x194);
      deSleep(0x50);
      (*(window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data
        .ptr)->_vptr_NativeWindow[4])();
      (*gl.disableVertexAttribArray)(GVar9);
      (*gl.useProgram)(0);
      GVar11 = (*gl.getError)();
      glu::checkError(GVar11,"Failed to release program state",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x19a);
      (*gl.deleteProgram)(GVar8);
      GVar11 = (*gl.getError)();
      glu::checkError(GVar11,"glDeleteProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x19e);
      pTVar2 = ((pSVar3->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&infoLogLength,&frameBegin);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&vertexInfoLog,&frameEnd);
      fragmentInfoLog._M_dataplus._M_p = (pointer)0x0;
      fragmentInfoLog._M_string_length = 0;
      bVar4 = tcu::intThresholdCompare
                        (pTVar2,"Compare end of frame against beginning of frame",
                         "Compare end of frame against beginning of frame",
                         (ConstPixelBufferAccess *)&infoLogLength,
                         (ConstPixelBufferAccess *)&vertexInfoLog,(UVec4 *)&fragmentInfoLog,
                         COMPARE_LOG_RESULT);
      if (!bVar4) {
        tcu::TestContext::setTestResult
                  ((pSVar3->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Screen pixels changed during frame");
      }
      (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                       ,0x1ac);
      goto LAB_00dd32c6;
    }
  }
  tcu::TestContext::setTestResult
            ((pSVar3->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,QP_TEST_RESULT_FAIL,"Couldn\'t reliably read pixels from screen");
LAB_00dd32c6:
  tcu::TextureLevel::~TextureLevel(&frameEnd);
  tcu::TextureLevel::~TextureLevel(&frameBegin);
  tcu::TextureLevel::~TextureLevel(&blackFrame);
  tcu::TextureLevel::~TextureLevel(&whiteFrame);
  eglu::UniqueContext::~UniqueContext(&context);
  eglu::UniqueSurface::~UniqueSurface(&surface);
  de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::~UniqueBase
            (&window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>);
  tcu::ScopedLogSection::~ScopedLogSection(&logSection);
  std::__cxx11::string::~string((string *)&configIdStr);
  return;
}

Assistant:

void SwapBuffersTest::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&						egl			= m_eglTestCtx.getLibrary();
	const string						configIdStr	(getConfigIdString(egl, display, config));
	tcu::ScopedLogSection				logSection	(m_testCtx.getLog(), ("Config ID " + configIdStr).c_str(), ("Config ID " + configIdStr).c_str());
	const int							waitFrames	= 5;
	const eglu::NativeWindowFactory&	factory		= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	if ((factory.getCapabilities() & eglu::NativeWindow::CAPABILITY_READ_SCREEN_PIXELS) == 0)
		TCU_THROW(NotSupportedError, "eglu::NativeWindow doesn't support readScreenPixels()");

	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Message << "EGL_RED_SIZE: "		<< eglu::getConfigAttribInt(egl, display, config, EGL_RED_SIZE)		<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_GREEN_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_GREEN_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_BLUE_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_BLUE_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_ALPHA_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_ALPHA_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_DEPTH_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_DEPTH_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_STENCIL_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_STENCIL_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_SAMPLES: "		<< eglu::getConfigAttribInt(egl, display, config, EGL_SAMPLES)		<< TestLog::EndMessage;

		log << TestLog::Message << "Waiting " << waitFrames * 16 << "ms after eglSwapBuffers() and glFinish() for frame to become visible" << TestLog::EndMessage;
	}

	de::UniquePtr<eglu::NativeWindow>	window	(factory.createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(128, 128, eglu::WindowParams::VISIBILITY_VISIBLE)));

	eglu::UniqueSurface					surface	(egl, display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, display, config, DE_NULL));
	eglu::UniqueContext					context	(egl, display, createGLES2Context(egl, display, config));
	glw::Functions						gl;
	deUint32							program = 0;

	tcu::TextureLevel					whiteFrame;
	tcu::TextureLevel					blackFrame;
	tcu::TextureLevel					frameBegin;
	tcu::TextureLevel					frameEnd;

	m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));
	EGLU_CHECK_CALL(egl, makeCurrent(display, *surface, *surface, *context));

	try
	{
		const float positions1[] = {
			 0.00f,  0.00f,
			 0.75f,  0.00f,
			 0.75f,  0.75f,

			 0.75f,  0.75f,
			 0.00f,  0.75f,
			 0.00f,  0.00f
		};

		const float positions2[] = {
			-0.75f, -0.75f,
			 0.00f, -0.75f,
			 0.00f,  0.00f,

			 0.00f,  0.00f,
			-0.75f,  0.00f,
			-0.75f, -0.75f
		};

		deUint32 posLocation;

		program	= createGLES2Program(gl, m_testCtx.getLog());

		gl.useProgram(program);
		posLocation	= gl.getAttribLocation(program, "a_pos");
		gl.enableVertexAttribArray(posLocation);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup shader program for rendering");

		// Clear screen to white and check that sceen is white
		gl.clearColor(1.0f, 1.0f, 1.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();
		window->readScreenPixels(&whiteFrame);

		if (!checkColor(m_testCtx.getLog(), whiteFrame, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f)))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Couldn't reliably read pixels from screen");
			return;
		}

		// Clear screen to black and check that sceen is black
		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();
		window->readScreenPixels(&blackFrame);

		if (!checkColor(m_testCtx.getLog(), blackFrame, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f)))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Couldn't reliably read pixels from screen");
			return;
		}

		gl.clearColor(0.7f, 1.0f, 0.3f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		gl.vertexAttribPointer(posLocation, 2, GL_FLOAT, GL_FALSE, 0, positions1);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to render");

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();
		window->readScreenPixels(&frameBegin);

		gl.clearColor(0.7f, 0.7f, 1.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		gl.vertexAttribPointer(posLocation, 2, GL_FLOAT, GL_FALSE, 0, positions2);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to render");

		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->readScreenPixels(&frameEnd);

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();

		gl.disableVertexAttribArray(posLocation);
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to release program state");

		gl.deleteProgram(program);
		program = 0;
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram()");

		if (!tcu::intThresholdCompare(m_testCtx.getLog(), "Compare end of frame against beginning of frame" , "Compare end of frame against beginning of frame", frameBegin.getAccess(), frameEnd.getAccess(), tcu::UVec4(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Screen pixels changed during frame");
	}
	catch (...)
	{
		if (program != 0)
			gl.deleteProgram(program);

		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		throw;
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
}